

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcemanager.cpp
# Opt level: O0

GLuint __thiscall
ResourceManager::getShader(ResourceManager *this,string *vtShader,string *fragShader,bool *succes)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_98;
  _Base_ptr local_90;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  local_88;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [8];
  string shaderKey;
  bool *succes_local;
  string *fragShader_local;
  string *vtShader_local;
  ResourceManager *this_local;
  
  std::operator+(local_70,(char *)vtShader);
  std::operator+(local_50,local_70);
  std::__cxx11::string::~string((string *)local_70);
  *succes = false;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::_Rb_tree_iterator(&local_88);
  local_90 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find(&this->loadedShaders,local_50);
  local_88._M_node = local_90;
  local_98._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::end(&this->loadedShaders);
  bVar1 = std::operator==(&local_88,&local_98);
  if (bVar1) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    *succes = true;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
             ::operator->(&local_88);
    this_local._4_4_ = ppVar2->second;
  }
  std::__cxx11::string::~string((string *)local_50);
  return this_local._4_4_;
}

Assistant:

GLuint ResourceManager::getShader(std::string vtShader, std::string fragShader, bool& succes)
{
	std::string shaderKey = vtShader + "," + fragShader;
	succes = false;
	std::map<std::string, GLuint>::iterator it;
	it = loadedShaders.find(shaderKey);
	if (it == loadedShaders.end())
	{
		return -1;
	}
	else
	{
		succes = true;
		return it->second;
	}
}